

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.h
# Opt level: O0

void __thiscall
cppcms::url_dispatcher::assign<foo>
          (url_dispatcher *this,string *regex,member_type member,foo *object)

{
  foo *in_RCX;
  member_type in_RDX;
  function<void_()> *in_RSI;
  binder0<foo> *in_RDI;
  binder0<foo> local_70;
  undefined1 local_58 [88];
  
  binder0<foo>::binder0(&local_70,in_RDX,in_RCX);
  std::function<void()>::function<cppcms::url_dispatcher::binder0<foo>,void>(in_RSI,in_RDI);
  cppcms::url_dispatcher::assign(in_RDI,in_RSI,local_58);
  std::function<void_()>::~function((function<void_()> *)0x137af8);
  return;
}

Assistant:

void assign(std::string const &regex,void (C::*member)(),C *object)
		{
			assign(regex,binder0<C>(member,object));
		}